

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

string * __thiscall
FIX::error_strerror_abi_cxx11_(string *__return_storage_ptr__,FIX *this,int *error_number)

{
  char *__rhs;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  FIX *local_18;
  int *error_number_local;
  
  local_18 = this;
  error_number_local = (int *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_98,*(int *)this);
  std::operator+(&local_78,"(errno[",&local_98);
  std::operator+(&local_58,&local_78,"]:");
  __rhs = strerror(*(int *)local_18);
  std::operator+(&local_38,&local_58,__rhs);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string error_strerror(decltype(errno) error_number) {
  return "(errno[" + std::to_string(error_number) + "]:" + std::strerror(error_number) + ")";
}